

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Int_Input.H
# Opt level: O1

void __thiscall Fl_Int_Input::~Fl_Int_Input(Fl_Int_Input *this)

{
  Fl_Input_::~Fl_Input_((Fl_Input_ *)this);
  operator_delete(this,200);
  return;
}

Assistant:

class FL_EXPORT Fl_Int_Input : public Fl_Input {
public:
  /**
    Creates a new Fl_Int_Input widget using the given position,
    size, and label string. The default boxtype is FL_DOWN_BOX.

    Inherited destructor destroys the widget and any value associated with it.
  */
  Fl_Int_Input(int X,int Y,int W,int H,const char *l = 0);
}